

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall bytearray_undo_rec::~bytearray_undo_rec(bytearray_undo_rec *this)

{
  undefined8 *puVar1;
  long in_RDI;
  bytearray_undo_bytes *nxt;
  bytearray_undo_bytes *cur;
  undefined8 local_10;
  
  local_10 = *(undefined8 **)(in_RDI + 0x10);
  while (local_10 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_10;
    free(local_10);
    local_10 = puVar1;
  }
  return;
}

Assistant:

~bytearray_undo_rec()
    {
        bytearray_undo_bytes *cur;
        bytearray_undo_bytes *nxt;

        /* delete our list of saved byte blocks */
        for (cur = save_head_ ; cur != 0 ; cur = nxt)
        {
            /* 
             *   remember the next one, as we're about to lose the current
             *   one's memory 
             */
            nxt = cur->nxt_;

            /* delete this one */
            t3free(cur);
        }
    }